

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apple_sysf.cpp
# Opt level: O2

void __thiscall apple_sysf_t::_read(apple_sysf_t *this)

{
  sysf_store_body_t *psVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  long lVar5;
  kstream *pkVar6;
  sysf_store_body_t *this_00;
  pointer __p;
  string local_38;
  
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_signature = uVar4;
  uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_unknown = uVar2;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_unknown1 = uVar4;
  uVar3 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_sysf_size = uVar3;
  pkVar6 = (this->super_kstruct).m__io;
  if (this->f_len_sysf_store_header == true) {
    lVar5 = (long)this->m_len_sysf_store_header;
  }
  else {
    this->f_len_sysf_store_header = true;
    this->m_len_sysf_store_header = '\v';
    lVar5 = 0xb;
  }
  kaitai::kstream::read_bytes_abi_cxx11_(&local_38,pkVar6,((ulong)uVar3 - lVar5) + -4);
  std::__cxx11::string::operator=((string *)&this->m__raw_body,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pkVar6 = (kstream *)operator_new(0x198);
  kaitai::kstream::kstream(pkVar6,&this->m__raw_body);
  local_38._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::reset
            ((__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)
             &this->m__io__raw_body,pkVar6);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
            ((unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)&local_38);
  this_00 = (sysf_store_body_t *)operator_new(0x30);
  sysf_store_body_t::sysf_store_body_t
            (this_00,(this->m__io__raw_body)._M_t.
                     super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>
                     .super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl,this,
             this->m__root);
  psVar1 = (this->m_body)._M_t.
           super___uniq_ptr_impl<apple_sysf_t::sysf_store_body_t,_std::default_delete<apple_sysf_t::sysf_store_body_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_apple_sysf_t::sysf_store_body_t_*,_std::default_delete<apple_sysf_t::sysf_store_body_t>_>
           .super__Head_base<0UL,_apple_sysf_t::sysf_store_body_t_*,_false>._M_head_impl;
  (this->m_body)._M_t.
  super___uniq_ptr_impl<apple_sysf_t::sysf_store_body_t,_std::default_delete<apple_sysf_t::sysf_store_body_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_apple_sysf_t::sysf_store_body_t_*,_std::default_delete<apple_sysf_t::sysf_store_body_t>_>
  .super__Head_base<0UL,_apple_sysf_t::sysf_store_body_t_*,_false>._M_head_impl = this_00;
  if (psVar1 != (sysf_store_body_t *)0x0) {
    (**(code **)((long)(psVar1->super_kstruct)._vptr_kstruct + 8))();
  }
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_crc = uVar4;
  return;
}

Assistant:

void apple_sysf_t::_read() {
    m_signature = m__io->read_u4le();
    m_unknown = m__io->read_u1();
    m_unknown1 = m__io->read_u4le();
    m_sysf_size = m__io->read_u2le();
    m__raw_body = m__io->read_bytes(((sysf_size() - len_sysf_store_header()) - 4));
    m__io__raw_body = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_body));
    m_body = std::unique_ptr<sysf_store_body_t>(new sysf_store_body_t(m__io__raw_body.get(), this, m__root));
    m_crc = m__io->read_u4le();
}